

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O0

void nhdp_domain_process_mpr_tlv
               (uint8_t *mprtypes,size_t mprtypes_size,nhdp_link *lnk,
               rfc5444_reader_tlvblock_entry *tlv)

{
  list_entity *plVar1;
  list_entity *plVar2;
  char *pcVar3;
  nhdp_domain *pnVar4;
  ulong uVar5;
  list_entity *plVar6;
  list_entity *plVar7;
  list_entity *__tempptr_8;
  list_entity *__tempptr_7;
  list_entity *__tempptr_6;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  size_t i;
  size_t byte_idx;
  size_t bit_idx;
  nhdp_neighbor *neigh;
  nhdp_domain *domain;
  rfc5444_reader_tlvblock_entry *tlv_local;
  nhdp_link *lnk_local;
  size_t mprtypes_size_local;
  uint8_t *mprtypes_local;
  
  lnk->local_is_flooding_mpr = false;
  for (plVar1 = _domain_list.next; plVar1->prev != _domain_list.prev; plVar1 = plVar1->next) {
    lnk->neigh->_domaindata[*(int *)((long)&plVar1[-0x27].next + 4)].local_is_mpr = false;
  }
  if (tlv != (rfc5444_reader_tlvblock_entry *)0x0) {
    lnk->local_is_flooding_mpr = (*tlv->single_value & 1) != 0;
    if (((&log_global_mask)[LOG_NHDP_R] & 1) != 0) {
      pcVar3 = "false";
      if ((lnk->local_is_flooding_mpr & 1U) != 0) {
        pcVar3 = "true";
      }
      oonf_log(1,LOG_NHDP_R,"src/nhdp/nhdp/nhdp_domain.c",0x289,0,0,"Flooding MPR for neighbor: %s",
               pcVar3);
    }
    for (__tempptr = (list_entity *)0x0; __tempptr < mprtypes_size;
        __tempptr = (list_entity *)((long)&__tempptr->next + 1)) {
      pnVar4 = nhdp_domain_get_by_ext(mprtypes[(long)__tempptr]);
      if (pnVar4 != (nhdp_domain *)0x0) {
        uVar5 = (ulong)((long)&__tempptr->next + 1U) >> 3;
        if ((uVar5 < tlv->length) &&
           (lnk->neigh->_domaindata[pnVar4->index].local_is_mpr =
                 ((uint)tlv->single_value[uVar5] & 1 << ((char)__tempptr + 1U & 7)) != 0,
           ((&log_global_mask)[LOG_NHDP_R] & 1) != 0)) {
          pcVar3 = "false";
          if ((lnk->neigh->_domaindata[pnVar4->index].local_is_mpr & 1U) != 0) {
            pcVar3 = "true";
          }
          oonf_log(1,LOG_NHDP_R,"src/nhdp/nhdp/nhdp_domain.c",0x29c,0,0,
                   "Routing MPR for neighbor in domain %u: %s",pnVar4->ext,pcVar3);
        }
      }
    }
    _node_is_selected_as_mpr = false;
    for (plVar1 = _domain_list.next; plVar1->prev != _domain_list.prev; plVar1 = plVar1->next) {
      plVar6 = nhdp_db_get_neigh_list();
      for (plVar6 = plVar6->next; plVar2 = plVar6->prev, plVar7 = nhdp_db_get_neigh_list(),
          plVar2 != plVar7->prev; plVar6 = plVar6->next) {
        if (((ulong)plVar6[(long)*(int *)((long)&plVar1[-0x27].next + 4) * 2 + 6].next & 1) != 0) {
          _node_is_selected_as_mpr = true;
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void
nhdp_domain_process_mpr_tlv(
  uint8_t *mprtypes, size_t mprtypes_size, struct nhdp_link *lnk, struct rfc5444_reader_tlvblock_entry *tlv) {
  struct nhdp_domain *domain;
  struct nhdp_neighbor *neigh;
  size_t bit_idx, byte_idx;
  size_t i;

  lnk->local_is_flooding_mpr = false;
  list_for_each_element(&_domain_list, domain, _node) {
    nhdp_domain_get_neighbordata(domain, lnk->neigh)->local_is_mpr = false;
  }

  if (!tlv) {
    return;
  }

  /* set flooding MPR flag */
  lnk->local_is_flooding_mpr = (tlv->single_value[0] & RFC7181_MPR_FLOODING) != 0;
  OONF_DEBUG(LOG_NHDP_R, "Flooding MPR for neighbor: %s", lnk->local_is_flooding_mpr ? "true" : "false");

  /* set routing MPR flags */
  for (i = 0; i < mprtypes_size; i++) {
    domain = nhdp_domain_get_by_ext(mprtypes[i]);
    if (domain == NULL) {
      continue;
    }
    bit_idx = (i + 1) & 7;
    byte_idx = (i + 1) >> 3;

    if (byte_idx >= tlv->length) {
      continue;
    }

    nhdp_domain_get_neighbordata(domain, lnk->neigh)->local_is_mpr =
      (tlv->single_value[byte_idx] & (1 << bit_idx)) != 0;

    OONF_DEBUG(LOG_NHDP_R, "Routing MPR for neighbor in domain %u: %s", domain->ext,
      nhdp_domain_get_neighbordata(domain, lnk->neigh)->local_is_mpr ? "true" : "false");
  }

  _node_is_selected_as_mpr = false;
  list_for_each_element(&_domain_list, domain, _node) {
    list_for_each_element(nhdp_db_get_neigh_list(), neigh, _global_node) {
      if (nhdp_domain_get_neighbordata(domain, neigh)->local_is_mpr) {
        _node_is_selected_as_mpr = true;
        return;
      }
    }
  }
}